

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O3

void easm_print_sinsn(FILE *out,envy_colors *cols,easm_sinsn *sinsn)

{
  char **ppcVar1;
  long lVar2;
  
  ppcVar1 = &cols->err;
  if (sinsn->isunk == 0) {
    ppcVar1 = &cols->iname;
  }
  fprintf((FILE *)out,"%s%s%s",*ppcVar1,sinsn->str,cols->reset);
  if (0 < sinsn->operandsnum) {
    lVar2 = 0;
    do {
      easm_print_operand(out,cols,sinsn->operands[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < sinsn->operandsnum);
  }
  easm_print_mods(out,cols,sinsn->mods,0);
  return;
}

Assistant:

void easm_print_sinsn(FILE *out, const struct envy_colors *cols, struct easm_sinsn *sinsn) {
	int i;
	if (sinsn->isunk)
		fprintf(out, "%s%s%s", cols->err, sinsn->str, cols->reset);
	else
		fprintf(out, "%s%s%s", cols->iname, sinsn->str, cols->reset);
	for (i = 0; i < sinsn->operandsnum; i++) {
		easm_print_operand(out, cols, sinsn->operands[i]);
	}
	easm_print_mods(out, cols, sinsn->mods, 0);
}